

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferBase.hpp
# Opt level: O2

void __thiscall
Diligent::FramebufferBase<Diligent::EngineGLImplTraits>::~FramebufferBase
          (FramebufferBase<Diligent::EngineGLImplTraits> *this)

{
  uint uVar1;
  int iVar2;
  IMemoryAllocator *pIVar3;
  undefined4 extraout_var;
  char (*in_RCX) [27];
  Uint32 i;
  ulong uVar4;
  Uint32 i_1;
  string msg;
  string local_38;
  
  (this->
  super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
  ).super_ObjectBase<Diligent::IFramebuffer>.super_RefCountedObject<Diligent::IFramebuffer>.
  super_IFramebuffer.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_00a5a270;
  if ((this->
      super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
      ).m_Desc.AttachmentCount != 0) {
    if (this->m_ppAttachments == (ITextureView **)0x0) {
      FormatString<char[26],char[27]>
                (&local_38,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_ppAttachments != nullptr",in_RCX);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"~FramebufferBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                 ,0xac);
      std::__cxx11::string::~string((string *)&local_38);
    }
    for (uVar4 = 0;
        uVar4 < (this->
                super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                ).m_Desc.AttachmentCount; uVar4 = uVar4 + 1) {
      if (this->m_ppAttachments[uVar4] != (ITextureView *)0x0) {
        (*(this->m_ppAttachments[uVar4]->super_IDeviceObject).super_IObject._vptr_IObject[2])();
      }
    }
    pIVar3 = GetRawAllocator();
    (*pIVar3->_vptr_IMemoryAllocator[1])(pIVar3,this->m_ppAttachments);
  }
  if (this->m_ppReadOnlyDSVs != (ITextureView **)0x0) {
    iVar2 = (*(((this->
                super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                ).m_Desc.pRenderPass)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    uVar1 = *(uint *)(CONCAT44(extraout_var,iVar2) + 0x18);
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      if (this->m_ppReadOnlyDSVs[uVar4] != (ITextureView *)0x0) {
        (*(this->m_ppReadOnlyDSVs[uVar4]->super_IDeviceObject).super_IObject._vptr_IObject[2])();
      }
    }
    pIVar3 = GetRawAllocator();
    (*pIVar3->_vptr_IMemoryAllocator[1])(pIVar3,this->m_ppReadOnlyDSVs);
  }
  (*(((this->
      super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
      ).m_Desc.pRenderPass)->super_IDeviceObject).super_IObject._vptr_IObject[2])();
  DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
  ::~DeviceObjectBase(&this->
                       super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                     );
  return;
}

Assistant:

~FramebufferBase()
    {
        if (this->m_Desc.AttachmentCount > 0)
        {
            VERIFY_EXPR(m_ppAttachments != nullptr);
            for (Uint32 i = 0; i < this->m_Desc.AttachmentCount; ++i)
            {
                if (m_ppAttachments[i] != nullptr)
                    m_ppAttachments[i]->Release();
            }
            GetRawAllocator().Free(m_ppAttachments);
        }

        if (m_ppReadOnlyDSVs != nullptr)
        {
            const auto SubpassCount = this->m_Desc.pRenderPass->GetDesc().SubpassCount;
            for (Uint32 i = 0; i < SubpassCount; ++i)
            {
                if (m_ppReadOnlyDSVs[i] != nullptr)
                    m_ppReadOnlyDSVs[i]->Release();
            }
            GetRawAllocator().Free(m_ppReadOnlyDSVs);
        }

        this->m_Desc.pRenderPass->Release();
    }